

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

void enet_host_bandwidth_throttle(ENetHost *host)

{
  uint uVar1;
  ENetPeer **ppEVar2;
  ENetPeer *pEVar3;
  bool bVar4;
  enet_uint32 eVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  uint uVar16;
  bool bVar17;
  ENetProtocol command;
  ENetProtocol local_62;
  
  eVar5 = enet_time_get();
  uVar11 = eVar5 - host->bandwidthThrottleEpoch;
  if (999 < uVar11) {
    uVar13 = (uint)host->connectedPeers;
    host->bandwidthThrottleEpoch = eVar5;
    if (uVar13 != 0) {
      if (host->outgoingBandwidth == 0) {
        uVar12 = 0xffffffff;
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = (host->outgoingBandwidth * uVar11) / 1000;
        if (host->peerCount == 0) {
          uVar12 = 0;
        }
        else {
          sVar10 = 0;
          uVar12 = 0;
          do {
            if (host->peer_list[sVar10]->state - ENET_PEER_STATE_CONNECTED < 2) {
              uVar12 = uVar12 + host->peer_list[sVar10]->outgoingDataTotal;
            }
            sVar10 = sVar10 + 1;
          } while (host->peerCount != sVar10);
        }
      }
      if (host->bandwidthLimitedPeers == 0) {
        bVar17 = true;
      }
      else {
        sVar10 = host->peerCount;
        uVar16 = uVar13;
        do {
          uVar9 = 0x20;
          if (uVar7 < uVar12) {
            uVar9 = (uVar7 << 5) / uVar12;
          }
          bVar4 = false;
          if (sVar10 != 0) {
            ppEVar2 = host->peer_list;
            sVar15 = 0;
            do {
              pEVar3 = ppEVar2[sVar15];
              if (((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) &&
                  (pEVar3->incomingBandwidth != 0)) &&
                 (pEVar3->outgoingBandwidthThrottleEpoch != eVar5)) {
                uVar8 = pEVar3->incomingBandwidth * uVar11;
                uVar1 = pEVar3->outgoingDataTotal;
                if (uVar8 / 1000 < uVar1 * uVar9 >> 5) {
                  uVar8 = uVar8 / 1000;
                  uVar6 = (uVar8 << 5) / uVar1;
                  if (uVar8 << 5 < uVar1) {
                    uVar6 = 1;
                  }
                  pEVar3->packetThrottleLimit = uVar6;
                  if (uVar6 < pEVar3->packetThrottle) {
                    pEVar3->packetThrottle = uVar6;
                  }
                  pEVar3->outgoingBandwidthThrottleEpoch = eVar5;
                  pEVar3->incomingDataTotal = 0;
                  pEVar3->outgoingDataTotal = 0;
                  uVar16 = uVar16 - 1;
                  uVar7 = uVar7 - uVar8;
                  uVar12 = uVar12 - uVar8;
                  bVar4 = true;
                }
              }
              sVar15 = sVar15 + 1;
            } while (sVar10 != sVar15);
          }
          bVar17 = uVar16 != 0;
        } while ((bVar17) && (bVar4));
      }
      if (bVar17) {
        uVar11 = 0x20;
        if (uVar7 < uVar12) {
          uVar11 = (uVar7 << 5) / uVar12;
        }
        sVar10 = host->peerCount;
        if (sVar10 != 0) {
          ppEVar2 = host->peer_list;
          sVar15 = 0;
          do {
            pEVar3 = ppEVar2[sVar15];
            if ((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) &&
               (pEVar3->outgoingBandwidthThrottleEpoch != eVar5)) {
              pEVar3->packetThrottleLimit = uVar11;
              if (uVar11 < pEVar3->packetThrottle) {
                pEVar3->packetThrottle = uVar11;
              }
              pEVar3->incomingDataTotal = 0;
              pEVar3->outgoingDataTotal = 0;
            }
            sVar15 = sVar15 + 1;
          } while (sVar10 != sVar15);
        }
      }
      if (host->recalculateBandwidthLimits != 0) {
        host->recalculateBandwidthLimits = 0;
        uVar14 = (ulong)host->incomingBandwidth;
        if (host->incomingBandwidth == 0) {
          uVar11 = 0;
        }
        else {
          sVar10 = host->peerCount;
          do {
            bVar17 = false;
            uVar11 = (uint)(uVar14 / uVar13);
            if (sVar10 != 0) {
              ppEVar2 = host->peer_list;
              sVar15 = 0;
              do {
                pEVar3 = ppEVar2[sVar15];
                if (((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) &&
                    (pEVar3->incomingBandwidthThrottleEpoch != eVar5)) &&
                   ((uVar7 = pEVar3->outgoingBandwidth, uVar7 == 0 || (uVar7 < uVar11)))) {
                  pEVar3->incomingBandwidthThrottleEpoch = eVar5;
                  uVar13 = uVar13 - 1;
                  uVar14 = (ulong)((int)uVar14 - uVar7);
                  bVar17 = true;
                }
                sVar15 = sVar15 + 1;
              } while (sVar10 != sVar15);
            }
          } while ((uVar13 != 0) && (bVar17));
        }
        if (host->peerCount != 0) {
          uVar14 = 0;
          do {
            pEVar3 = host->peer_list[uVar14];
            if (pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) {
              local_62._0_2_ = 0xff8a;
              uVar13 = host->outgoingBandwidth;
              local_62.sendFragment.fragmentCount =
                   uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18;
              local_62.connect.outgoingPeerID =
                   uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
              if (pEVar3->incomingBandwidthThrottleEpoch == eVar5) {
                uVar13 = pEVar3->outgoingBandwidth;
                local_62.connect.outgoingPeerID =
                     uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
              }
              enet_peer_queue_outgoing_command(pEVar3,&local_62,(ENetPacket *)0x0,0,0);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < host->peerCount);
        }
      }
    }
  }
  return;
}

Assistant:

void
enet_host_bandwidth_throttle (ENetHost * host)
{
    enet_uint32 timeCurrent = enet_time_get (),
           elapsedTime = timeCurrent - host -> bandwidthThrottleEpoch,
           peersRemaining = (enet_uint32) host -> connectedPeers,
           dataTotal = ~0,
           bandwidth = ~0,
           throttle = 0,
           bandwidthLimit = 0;
    int needsAdjustment = host -> bandwidthLimitedPeers > 0 ? 1 : 0;
    ENetPeer * peer;
    ENetProtocol command;
    int i;

    if (elapsedTime < ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
      return;

    host -> bandwidthThrottleEpoch = timeCurrent;

    if (peersRemaining == 0)
      return;

    if (host -> outgoingBandwidth != 0)
    {
        dataTotal = 0;
        bandwidth = (host -> outgoingBandwidth * elapsedTime) / 1000;

	for (i = 0; i < host -> peerCount; i++ )
        {
	    peer = host -> peer_list[i];

            if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
              continue;

            dataTotal += peer -> outgoingDataTotal;
        }
    }

    while (peersRemaining > 0 && needsAdjustment != 0)
    {
        needsAdjustment = 0;
        
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

	for (i = 0; i < host -> peerCount; i++ )
	{
            enet_uint32 peerBandwidth;
	    peer = host -> peer_list[i];
            
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> incomingBandwidth == 0 ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peerBandwidth = (peer -> incomingBandwidth * elapsedTime) / 1000;
            if ((throttle * peer -> outgoingDataTotal) / ENET_PEER_PACKET_THROTTLE_SCALE <= peerBandwidth)
              continue;

            peer -> packetThrottleLimit = (peerBandwidth * 
                                            ENET_PEER_PACKET_THROTTLE_SCALE) / peer -> outgoingDataTotal;
            
            if (peer -> packetThrottleLimit == 0)
              peer -> packetThrottleLimit = 1;
            
            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> outgoingBandwidthThrottleEpoch = timeCurrent;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;

            needsAdjustment = 1;
            -- peersRemaining;
            bandwidth -= peerBandwidth;
            dataTotal -= peerBandwidth;
        }
    }

    if (peersRemaining > 0)
    {
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

	for (i = 0; i < host -> peerCount; i++ )
	{
	    peer = host -> peer_list[i];

            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
		peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
	      continue;

	    peer -> packetThrottleLimit = throttle;

	    if (peer -> packetThrottle > peer -> packetThrottleLimit)
		peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;
	}
    }

    if (host -> recalculateBandwidthLimits)
    {
       host -> recalculateBandwidthLimits = 0;

       peersRemaining = (enet_uint32) host -> connectedPeers;
       bandwidth = host -> incomingBandwidth;
       needsAdjustment = 1;

       if (bandwidth == 0)
         bandwidthLimit = 0;
       else
       while (peersRemaining > 0 && needsAdjustment != 0)
       {
           needsAdjustment = 0;
           bandwidthLimit = bandwidth / peersRemaining;

	   for (i = 0; i < host -> peerCount; i++ )
	   {
	       peer = host -> peer_list[i];
               if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                   peer -> incomingBandwidthThrottleEpoch == timeCurrent)
                 continue;

               if (peer -> outgoingBandwidth > 0 &&
                   peer -> outgoingBandwidth >= bandwidthLimit)
                 continue;

               peer -> incomingBandwidthThrottleEpoch = timeCurrent;
 
               needsAdjustment = 1;
               -- peersRemaining;
               bandwidth -= peer -> outgoingBandwidth;
           }
       }

       for (i = 0; i < host -> peerCount; i++ )
       {
	   peer = host -> peer_list[i];

           if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
             continue;

           command.header.command = ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
           command.header.channelID = 0xFF;
           command.bandwidthLimit.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);

           if (peer -> incomingBandwidthThrottleEpoch == timeCurrent)
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (peer -> outgoingBandwidth);
           else
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (bandwidthLimit);

           enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
       } 
    }
}